

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O3

void av1_build_inter_predictors_for_planes_single_buf
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane_from,int plane_to,int ref,
               uint8_t **ext_dst,int *ext_dst_stride)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  MB_MODE_INFO *mi;
  ulong uVar5;
  InterpFilterParams *pIVar6;
  long lVar7;
  qm_val_t **ppqVar8;
  ulong uVar9;
  uint8_t *dst;
  byte bVar10;
  long lVar11;
  WarpTypesAllowed warp_types;
  WarpTypesAllowed local_148;
  ulong local_140;
  int *local_138;
  uint8_t **local_130;
  long local_128;
  BLOCK_SIZE (*local_120) [2] [2];
  long local_118;
  scale_factors *local_110;
  InterPredParams local_108;
  
  mi = *xd->mi;
  lVar11 = (long)ref;
  bVar10 = block_size_high[mi->bsize];
  if (block_size_wide[mi->bsize] < block_size_high[mi->bsize]) {
    bVar10 = block_size_wide[mi->bsize];
  }
  iVar2 = xd->mi_row;
  iVar3 = xd->mi_col;
  local_148.global_warp_allowed =
       (int)((1 < xd->global_motion[mi->ref_frame[lVar11]].wmtype && (mi->mode - 0xf & 0xf7) == 0)
            && 7 < bVar10);
  local_148.local_warp_allowed = (int)(mi->motion_mode == '\x02');
  if (plane_from <= plane_to) {
    local_128 = lVar11 * 0x20 + 0x40;
    ppqVar8 = xd->plane[(long)plane_from + -1].seg_qmatrix[7] + 0x11;
    local_130 = ext_dst + plane_from;
    local_138 = ext_dst_stride + plane_from;
    local_140 = (ulong)(uint)plane_from;
    local_118 = (uint)~plane_to + local_140;
    local_120 = av1_ss_size_lookup + bsize;
    lVar7 = 0;
    do {
      local_108.subsampling_x = *(int *)((long)ppqVar8 + 0x14);
      local_108.subsampling_y = *(int *)(ppqVar8 + 3);
      uVar9 = (ulong)(*local_120)[local_108.subsampling_x][local_108.subsampling_y];
      local_108.pix_row = (iVar2 << 2) >> ((byte)local_108.subsampling_y & 0x1f);
      local_108.bit_depth = xd->bd;
      local_110 = xd->block_ref_scale_factors[lVar11];
      uVar4 = (mi->interp_filters).as_int;
      local_108.block_width = (int)block_size_wide[uVar9];
      local_108.pix_col = (iVar3 << 2) >> ((byte)local_108.subsampling_x & 0x1f);
      local_108.block_height = (int)block_size_high[uVar9];
      local_108.use_hbd_buf = (uint)xd->cur_buf->flags >> 3 & 1;
      local_108.top = (0x120U >> ((byte)local_108.subsampling_y & 0x1f)) * -0x400 + 0x1000;
      local_108.left = (0x120U >> ((byte)local_108.subsampling_x & 0x1f)) * -0x400 + 0x1000;
      uVar5 = (ulong)(uVar4 >> 0xc & 0xff0);
      pIVar6 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar5);
      local_108.interp_filter_params[0] =
           (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar5);
      if ((char)(uVar4 >> 0x10) == '\x04') {
        local_108.interp_filter_params[0] = pIVar6;
      }
      if ((0x10003UL >> (uVar9 & 0x3f) & 1) == 0) {
        local_108.interp_filter_params[0] = pIVar6;
      }
      uVar5 = (ulong)((uVar4 & 0xff) << 4);
      pIVar6 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar5);
      local_108.is_intrabc = 0;
      local_108.mode = TRANSLATION_PRED;
      local_108.comp_mode = UNIFORM_SINGLE;
      local_108.interp_filter_params[1] =
           (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar5);
      if ((char)uVar4 == '\x04') {
        local_108.interp_filter_params[1] = pIVar6;
      }
      if ((0x20005UL >> (uVar9 & 0x3f) & 1) == 0) {
        local_108.interp_filter_params[1] = pIVar6;
      }
      local_108.ref_frame_buf.buf = *(uint8_t **)((long)ppqVar8 + local_128);
      local_108.ref_frame_buf.buf0 = (uint8_t *)((undefined8 *)((long)ppqVar8 + local_128))[1];
      puVar1 = (undefined8 *)((long)ppqVar8 + local_128 + 0x10);
      local_108.ref_frame_buf._16_8_ = *puVar1;
      local_108.ref_frame_buf._24_8_ = puVar1[1];
      local_108.conv_params.round_1 = 0x15 - local_108.bit_depth;
      local_108.conv_params.round_0 = local_108.bit_depth + -7;
      if (local_108.bit_depth < 0xb) {
        local_108.conv_params.round_0 = 3;
      }
      local_108.conv_params.do_average = 0;
      local_108.conv_params.dst = (CONV_BUF_TYPE *)0x0;
      local_108.conv_params.dst_stride = 0;
      if (local_108.bit_depth < 0xb) {
        local_108.conv_params.round_1 = 0xb;
      }
      local_108.conv_params.plane = (int)local_140 + (int)lVar7;
      local_108.conv_params.is_compound = 0;
      local_108.conv_params.use_dist_wtd_comp_avg = 0;
      local_108.scale_factors = local_110;
      av1_init_warp_params(&local_108,&local_148,ref,xd,mi);
      dst = (uint8_t *)((ulong)local_130[lVar7] >> 1);
      if ((xd->cur_buf->flags & 8) == 0) {
        dst = local_130[lVar7];
      }
      build_one_inter_predictor
                (dst,local_138[lVar7],(MV *)(ulong)mi->mv[lVar11].as_int,
                 (InterPredParams *)(ulong)(mi->mv[lVar11].as_int >> 0x10));
      ppqVar8 = ppqVar8 + 0x146;
      lVar7 = lVar7 + 1;
    } while ((int)local_118 + (int)lVar7 != 0);
  }
  return;
}

Assistant:

void av1_build_inter_predictors_for_planes_single_buf(
    MACROBLOCKD *xd, BLOCK_SIZE bsize, int plane_from, int plane_to, int ref,
    uint8_t *ext_dst[], int ext_dst_stride[]) {
  assert(bsize < BLOCK_SIZES_ALL);
  const MB_MODE_INFO *mi = xd->mi[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_x = mi_col * MI_SIZE;
  const int mi_y = mi_row * MI_SIZE;
  WarpTypesAllowed warp_types;
  const WarpedMotionParams *const wm = &xd->global_motion[mi->ref_frame[ref]];
  warp_types.global_warp_allowed = is_global_mv_block(mi, wm->wmtype);
  warp_types.local_warp_allowed = mi->motion_mode == WARPED_CAUSAL;

  for (int plane = plane_from; plane <= plane_to; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];

    InterPredParams inter_pred_params;

    av1_init_inter_params(&inter_pred_params, bw, bh, mi_y >> pd->subsampling_y,
                          mi_x >> pd->subsampling_x, pd->subsampling_x,
                          pd->subsampling_y, xd->bd, is_cur_buf_hbd(xd), 0,
                          xd->block_ref_scale_factors[ref], &pd->pre[ref],
                          mi->interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
    av1_init_warp_params(&inter_pred_params, &warp_types, ref, xd, mi);

    uint8_t *const dst = get_buf_by_bd(xd, ext_dst[plane]);
    const MV mv = mi->mv[ref].as_mv;

    av1_enc_build_one_inter_predictor(dst, ext_dst_stride[plane], &mv,
                                      &inter_pred_params);
  }
}